

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

int __thiscall Grid::operator()(Grid *this,point p)

{
  cg_box *this_00;
  cg_other *pcVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  if ((((p.x < 0) || ((long)p < 0)) || (this_00 = (this->box).ptr, this_00->w <= p.x)) ||
     (this_00->h <= p.y)) {
    pcVar1 = (this->other).ptr;
    pcVar2 = (pcVar1->data).
             super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = -1;
    lVar7 = (long)(pcVar1->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2;
    if (lVar7 != 0) {
      uVar5 = (lVar7 >> 2) * -0x5555555555555555;
      uVar6 = 1;
      uVar8 = 0;
      do {
        if (pcVar2[uVar8].p == p) {
          piVar4 = (int *)((long)(pcVar2 + uVar8) + 8);
          goto LAB_0010d965;
        }
        uVar8 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
    }
  }
  else {
    piVar4 = cg_box::at(this_00,p);
LAB_0010d965:
    iVar3 = *piVar4;
  }
  return iVar3;
}

Assistant:

int Grid::operator()(point p) {
    if (box->contains(p)) {
        return box->at(p);
    }
    return (*other)(p);
}